

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O0

void pnga_nbput_notify(Integer g_a,Integer *lo,Integer *hi,void *buf,Integer *ld,Integer g_b,
                      Integer *ecoords,void *bufn,Integer *nbhandle)

{
  int iVar1;
  int iVar2;
  void *buf_00;
  void *__dest;
  long in_RDI;
  long in_R9;
  char *elem;
  void *elem_copy;
  Integer size;
  Integer handle;
  int i;
  int ret;
  int intersect;
  int pos;
  Integer ldn [7];
  Integer in_stack_000000f8;
  char *in_stack_00000100;
  Integer in_stack_00000620;
  Integer *in_stack_00000628;
  void *in_stack_00000630;
  Integer *in_stack_00000638;
  Integer *in_stack_00000640;
  Integer in_stack_00000648;
  Integer in_stack_00000670;
  Integer *in_stack_00000678;
  Integer *in_stack_ffffffffffffff60;
  Integer *in_stack_ffffffffffffff68;
  Integer *in_stack_ffffffffffffff70;
  Integer in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined8 local_68;
  void *in_stack_ffffffffffffffa0;
  Integer in_stack_ffffffffffffffa8;
  
  memset(&local_68,0,0x38);
  local_68 = 1;
  if (putn_handles_initted == 0) {
    memset(putn_handles,0,0xc80);
    putn_handles_initted = 1;
  }
  iVar1 = putn_find_empty_slot();
  if (iVar1 == -1) {
    pnga_error(in_stack_00000100,in_stack_000000f8);
  }
  putn_handles[iVar1].orighdl = (Integer *)elem_copy;
  if (in_RDI == in_R9) {
    iVar2 = putn_intersect_coords
                      (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68
                       ,in_stack_ffffffffffffff60);
  }
  else {
    iVar2 = 0;
  }
  if (iVar2 == 0) {
    ngai_put_common(in_stack_00000648,in_stack_00000640,in_stack_00000638,in_stack_00000630,
                    in_stack_00000628,in_stack_00000620,in_stack_00000670,in_stack_00000678);
    ngai_put_common(in_stack_00000648,in_stack_00000640,in_stack_00000638,in_stack_00000630,
                    in_stack_00000628,in_stack_00000620,in_stack_00000670,in_stack_00000678);
    putn_handles[iVar1].elem_copy = (void *)0x0;
  }
  else {
    buf_00 = (void *)(long)GA[in_RDI + 1000].elemsize;
    iVar2 = putn_verify_element_in_buf
                      (CONCAT44(iVar1,iVar2),
                       (Integer *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                       (Integer *)(in_RDI + 1000),buf_00,in_stack_ffffffffffffff70,
                       in_stack_ffffffffffffff68,in_stack_ffffffffffffffa0,in_stack_ffffffffffffffa8
                      );
    if (iVar2 == 0) {
      pnga_error(in_stack_00000100,in_stack_000000f8);
    }
    __dest = malloc((size_t)buf_00);
    memcpy(__dest,elem,(size_t)buf_00);
    for (iVar2 = 0; (long)iVar2 < (long)buf_00; iVar2 = iVar2 + 1) {
      elem[iVar2] = elem[iVar2] + '\x01';
    }
    putn_handles[iVar1].elem_copy = __dest;
    ngai_put_common(in_stack_00000648,in_stack_00000640,in_stack_00000638,in_stack_00000630,
                    in_stack_00000628,in_stack_00000620,in_stack_00000670,in_stack_00000678);
    ngai_put_common(in_stack_00000648,in_stack_00000640,in_stack_00000638,in_stack_00000630,
                    in_stack_00000628,in_stack_00000620,in_stack_00000670,in_stack_00000678);
  }
  return;
}

Assistant:

void pnga_nbput_notify(Integer g_a, Integer *lo, Integer *hi, void *buf, Integer *ld, Integer g_b, Integer *ecoords, void *bufn, Integer *nbhandle)
{
  Integer ldn[MAXDIM] = { 1 };
  int pos, intersect;

  /* Make sure everything has been initialized */
  if (!putn_handles_initted) {
    memset(putn_handles, 0, sizeof(putn_handles));
    putn_handles_initted = 1;
  }

  pos = putn_find_empty_slot();
  if (pos == -1) /* no empty handles available */
    pnga_error("Too many outstanding put/notify operations!", 0);

  putn_handles[pos].orighdl = nbhandle; /* Store original handle for nbwait_notify */

  if (g_a == g_b)
    intersect = putn_intersect_coords(g_a, lo, hi, ecoords);
  else
    intersect = 0;

  if (!intersect) { /* Simpler case */
    ngai_put_common(g_a, lo, hi, buf, ld, 0, -1, &putn_handles[pos].firsthdl);
    ngai_put_common(g_b, ecoords, ecoords, bufn, ldn, 0, -1, &putn_handles[pos].elementhdl);

    putn_handles[pos].elem_copy = NULL;
  }
  else {
    int ret, i;
    Integer handle = GA_OFFSET + g_a, size;
    void *elem_copy;
    char *elem;

    size = GA[handle].elemsize;
    ret = putn_verify_element_in_buf(g_a, lo, hi, buf, ld, ecoords, bufn, size);

    if (!ret)
      pnga_error("Intersecting buffers, but notify element is not in buffer!", 0);

    elem_copy = malloc(size);
    memcpy(elem_copy, bufn, size);

    elem = bufn;
    for (i = 0; i < size; i++)
      elem[i] += 1; /* Increment each byte by one, safe? */

    putn_handles[pos].elem_copy = elem_copy;

    ngai_put_common(g_a, lo, hi, buf, ld, 0, -1, &putn_handles[pos].firsthdl);
    ngai_put_common(g_a, ecoords, ecoords, elem_copy, ldn, 0, -1,
		    &putn_handles[pos].elementhdl);
  }
}